

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ep.c
# Opt level: O3

void nn_ep_shutdown(nn_fsm *self,int src,int type,void *srcptr)

{
  if (type != -3 || (src ^ 0xfffffffeU) != 0) {
    if (*(int *)&self[1].fn == 3) {
      if ((src ^ 0xfffffffeU) != 0 || type != 1) {
        return;
      }
      *(undefined4 *)&self[1].fn = 1;
      nn_fsm_stopped(self,1);
      return;
    }
    nn_ep_shutdown_cold_1();
  }
  nn_ep_shutdown_cold_2();
  return;
}

Assistant:

static void nn_ep_shutdown (struct nn_fsm *self, int src, int type,
    NN_UNUSED void *srcptr)
{
    struct nn_ep *ep;

    ep = nn_cont (self, struct nn_ep, fsm);

    if (nn_slow (src == NN_FSM_ACTION && type == NN_FSM_STOP)) {
        ep->ops.stop (ep->tran);
        ep->state = NN_EP_STATE_STOPPING;
        return;
    }
    if (nn_slow (ep->state == NN_EP_STATE_STOPPING)) {
        if (src != NN_FSM_ACTION || type != NN_EP_ACTION_STOPPED)
            return;
        ep->state = NN_EP_STATE_IDLE;
        nn_fsm_stopped (&ep->fsm, NN_EP_STOPPED);
        return;
    }

    nn_fsm_bad_state (ep->state, src, type);
}